

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<int_*,_bool> __thiscall
HighsHashTree<int,_int>::InnerLeaf<1>::insert_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  unsigned_long *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  pair<int_*,_bool> pVar10;
  int local_1c;
  
  uVar9 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar2 = (byte)(uVar9 >> 10);
  uVar1 = (this->occupation).occupation;
  lVar3 = POPCOUNT(uVar1 >> (bVar2 & 0x3f));
  local_1c = (int)lVar3;
  if ((uVar1 >> (uVar9 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar1 | 1L << (bVar2 & 0x3f);
    if (local_1c < this->size) {
      iVar4 = local_1c + -1;
      puVar7 = (this->hashes)._M_elems + local_1c;
      do {
        iVar4 = iVar4 + 1;
        uVar1 = *puVar7;
        puVar7 = puVar7 + 1;
        local_1c = iVar4;
      } while ((uVar9 & 0xffff) < uVar1);
    }
  }
  else {
    do {
      lVar6 = lVar3;
      lVar3 = lVar6 + 1;
    } while ((uVar9 & 0xffff) < (this->hashes)._M_elems[lVar6 + -1]);
    lVar6 = lVar6 + -1;
    iVar5 = (int)lVar6;
    iVar4 = this->size;
    local_1c = iVar5;
    if (iVar4 + 2 != (int)lVar3) {
      do {
        local_1c = iVar5;
        if ((this->hashes)._M_elems[lVar3 + -2] != (uVar9 & 0xffff)) break;
        if (entry->key_ == (int)(this->hashes)._M_elems[lVar3 + 5]) {
          puVar7 = (this->hashes)._M_elems + (long)iVar5 + -2;
          uVar8 = 0;
          goto LAB_002770fd;
        }
        lVar6 = lVar6 + 1;
        lVar3 = lVar3 + 1;
        iVar5 = (int)lVar6;
        local_1c = iVar4;
      } while (iVar4 + 2 != (int)lVar3);
    }
  }
  if (local_1c < this->size) {
    move_backward(this,&local_1c,&this->size);
  }
  puVar7 = (this->hashes)._M_elems + (long)local_1c + -2;
  *(Entry *)(puVar7 + 9) = *entry;
  puVar7[2] = uVar9 & 0xffff;
  iVar4 = this->size;
  lVar3 = (long)iVar4 + 1;
  this->size = (int)lVar3;
  (this->hashes)._M_elems[(long)iVar4 + 1] = 0;
  uVar8 = CONCAT71((int7)((ulong)lVar3 >> 8),1);
LAB_002770fd:
  pVar10.first = (int *)((long)puVar7 + 0x4c);
  pVar10._8_8_ = uVar8;
  return pVar10;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }